

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *__rhs;
  char cVar1;
  char cVar2;
  cmCommand *pcVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  bool bVar10;
  string sdestdir;
  string message;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (iVar4 = std::__cxx11::string::compare((char *)__rhs), iVar4 != 0)) {
    pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "called with inappropriate arguments. No DESTINATION provided or .","");
    cmCommand::SetError(pcVar3,&local_70);
  }
  else {
    pcVar5 = cmsys::SystemTools::GetEnv("DESTDIR");
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar5 + sVar6);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
      pcVar5 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
      cVar1 = *pcVar5;
      if ((this->super_cmFileCopier).Destination._M_string_length < 3) {
        bVar10 = false;
      }
      else {
        bVar10 = pcVar5[2] == '/';
      }
      cVar2 = pcVar5[1];
      if (cVar1 == '/') {
        if (cVar2 != '/') {
LAB_002db77f:
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_70._M_dataplus._M_p,
                     local_70._M_dataplus._M_p + local_70._M_string_length);
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::operator=((string *)__rhs,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          this->DestDirLength = (int)local_70._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002db7f8;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
                   ,"");
        std::__cxx11::string::_M_append
                  ((char *)&local_50,(ulong)(this->super_cmFileCopier).Destination._M_dataplus._M_p)
        ;
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          if (cVar2 != ':') {
LAB_002db6ff:
            bVar10 = false;
          }
        }
        else if (0x19 < (byte)(cVar1 + 0xbfU) || cVar2 != ':') goto LAB_002db6ff;
        if (bVar10) goto LAB_002db77f;
        pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                   ,"");
        cmCommand::SetError(pcVar3,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return false;
      }
      goto LAB_002db979;
    }
LAB_002db7f8:
    if (*(int *)&(this->super_cmFileCopier).field_0xa4 == 6) {
      return true;
    }
    bVar10 = cmsys::SystemTools::FileExists((__rhs->_M_dataplus)._M_p);
    if ((bVar10) || (bVar10 = cmsys::SystemTools::MakeDirectory((__rhs->_M_dataplus)._M_p), bVar10))
    {
      bVar10 = cmsys::SystemTools::FileIsDirectory(__rhs);
      if (bVar10) {
        return true;
      }
      std::operator+(&local_50,"INSTALL destination: ",__rhs);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_70.field_2._M_allocated_capacity = *psVar9;
        local_70.field_2._8_8_ = plVar7[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar9;
        local_70._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_70._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_70);
    }
    else {
      std::operator+(&local_50,"cannot create directory: ",__rhs);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar9 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_70.field_2._M_allocated_capacity = *psVar9;
        local_70.field_2._8_8_ = puVar8[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar9;
        local_70._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_70._M_string_length = puVar8[1];
      *puVar8 = psVar9;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return false;
  }
LAB_002db979:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if ( destination.size() < 2 && destination != "/" )
    {
    this->FileCommand->SetError("called with inappropriate arguments. "
        "No DESTINATION provided or .");
    return false;
    }

  const char* destdir = cmSystemTools::GetEnv("DESTDIR");
  if ( destdir && *destdir )
    {
    std::string sdestdir = destdir;
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if ( destination.size() > 2 )
      {
      ch3 = destination[2];
      }
    int skip = 0;
    if ( ch1 != '/' )
      {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
             ch2 == ':' )
        {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if ( ch3 != '/' )
          {
          relative = 1;
          }
        }
      else
        {
        relative = 1;
        }
      if ( relative )
        {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->FileCommand->SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
        }
      }
    else
      {
      if ( ch2 == '/' )
        {
        // looks like a network path.
        std::string message = "called with network path DESTINATION. This "
          "does not make sense when using DESTDIR. Specify local "
          "absolute path or remove DESTDIR environment variable."
          "\nDESTINATION=\n";
        message += destination;
        this->FileCommand->SetError(message);
        return false;
        }
      }
    destination = sdestdir + (destination.c_str() + skip);
    this->DestDirLength = int(sdestdir.size());
    }

  if(this->InstallType != cmInstallType_DIRECTORY)
    {
    if ( !cmSystemTools::FileExists(destination.c_str()) )
      {
      if ( !cmSystemTools::MakeDirectory(destination.c_str()) )
        {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->FileCommand->SetError(errstring);
        return false;
        }
      }
    if ( !cmSystemTools::FileIsDirectory(destination) )
      {
      std::string errstring = "INSTALL destination: " + destination +
        " is not a directory.";
      this->FileCommand->SetError(errstring);
      return false;
      }
    }
  return true;
}